

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O1

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstComparisonCondition> *cExpr,int priority)

{
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  _func_int **pp_Var1;
  bool bVar2;
  undefined8 uVar3;
  AST_Parser *pAVar4;
  mapped_type *pmVar5;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  int in_R8D;
  element_type *this_02;
  element_type *peVar7;
  bool bVar8;
  bool bVar9;
  shared_ptr<nigel::AstReturning> sVar10;
  undefined1 local_b8 [24];
  _func_int **local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  shared_ptr<nigel::Token> local_88;
  AST_Parser *local_78;
  undefined1 local_70 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_98 = (element_type *)CONCAT44(in_register_0000000c,priority);
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  this_01 = &(cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount;
  local_a0 = (_func_int **)0x0;
  pp_Var1 = local_a0;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal;
  local_78 = this;
  this_02 = (element_type *)0x0;
  do {
    while( true ) {
      while( true ) {
        local_a0 = pp_Var1;
        if ((((cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr)->super_AstCondition).super_AstExpr.type == combinationCondition) {
          AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)&local_40);
          pmVar5 = std::
                   map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                   ::operator[](this_00,(key_type *)(local_40._M_pi + 5));
          bVar8 = *pmVar5 < in_R8D;
          if (local_38 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
          }
        }
        else {
          bVar8 = false;
        }
        if (!bVar8) break;
        AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_b8);
        uVar3 = local_b8._8_8_;
        pp_Var1 = (_func_int **)local_b8._0_8_;
        local_b8._0_8_ = (_func_int **)0x0;
        local_b8._8_8_ = (element_type *)0x0;
        if (this_02 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        }
        if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
        AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_b8);
        (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = *(element_type **)(local_b8._0_8_ + 0x40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_01,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8._0_8_ + 0x48));
        this_02 = (element_type *)uVar3;
        if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
      }
      if ((((cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_AstCondition).super_AstExpr.type == comparisonCondition) {
        AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)&local_50);
        pmVar5 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[](this_00,(key_type *)(local_50 + 1));
        bVar8 = *pmVar5 < in_R8D;
        if ((element_type *)local_48._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        }
      }
      else {
        bVar8 = false;
      }
      if (!bVar8) break;
      AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_b8);
      peVar7 = (element_type *)local_b8._8_8_;
      uVar3 = local_b8._0_8_;
      local_b8._0_8_ = (_func_int **)0x0;
      local_b8._8_8_ = (element_type *)0x0;
      if (this_02 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      }
      if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_b8);
      local_a0 = (_func_int **)uVar3;
      (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = *(element_type **)(local_b8._0_8_ + 0x40);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8._0_8_ + 0x48);
LAB_00138d53:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_01,__r);
      pp_Var1 = local_a0;
      this_02 = peVar7;
      if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        pp_Var1 = local_a0;
      }
    }
    bVar8 = (((cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr)->super_AstCondition).super_AstExpr.type == term;
    if (bVar8) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)(local_70 + 0x10));
      pmVar5 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)
                                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     (local_70._16_8_ + 0x50))->_M_use_count);
      if (in_R8D <= *pmVar5) goto LAB_00138b5e;
      bVar8 = true;
      bVar2 = false;
      bVar9 = true;
    }
    else {
LAB_00138b5e:
      local_b8._0_4_ = 0x2d;
      pmVar5 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)local_b8);
      if (*pmVar5 == in_R8D) {
        AstExpr::as<nigel::AstTerm>((AstExpr *)local_70);
        pmVar5 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[](this_00,(key_type *)(local_70._0_8_ + 0x58));
        bVar9 = *pmVar5 == in_R8D;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        bVar9 = false;
      }
    }
    if ((bVar2) && ((element_type *)local_70._8_8_ != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if ((bVar8) && (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (bVar9) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_b8);
      peVar7 = (element_type *)local_b8._8_8_;
      uVar3 = local_b8._0_8_;
      local_b8._0_8_ = (_func_int **)0x0;
      local_b8._8_8_ = (element_type *)0x0;
      if (this_02 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      }
      if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_b8);
      local_a0 = (_func_int **)uVar3;
      (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = *(element_type **)(local_b8._0_8_ + 0x48);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8._0_8_ + 0x50);
      goto LAB_00138d53;
    }
    if ((((cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->super_AstCondition).super_AstExpr.type != arithmenticCondition) {
      if (local_a0 == (_func_int **)0x0) {
        local_90._M_pi[0xb]._vptr__Sp_counted_base = (_func_int **)local_98->_vptr_Token;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_pi[0xb]._M_use_count,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_98->super_enable_shared_from_this<nigel::Token>);
      }
      else {
        if (*(int *)(local_a0 + 3) == 0xe) {
          AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_b8);
          *(_func_int ***)(local_b8._0_8_ + 0x40) = local_98->_vptr_Token;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8._0_8_ + 0x48),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_98->super_enable_shared_from_this<nigel::Token>);
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
        }
        else {
          local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_a0[4];
          local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0[5];
          if ((element_type *)
              local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((element_type *)
                        local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                       _M_weak_this.super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr =
                   *(int *)&(((element_type *)
                             local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                            _M_weak_this.
                            super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((element_type *)
                        local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                       _M_weak_this.super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr =
                   *(int *)&(((element_type *)
                             local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                            _M_weak_this.
                            super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
            }
          }
          BuilderExecutable::generateNotification
                    ((BuilderExecutable *)local_90._M_pi,err_comparisonConditionCannotBeThisRValue,
                     &local_88);
          _Var6._M_pi = local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
        }
        if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
      }
      pAVar4 = local_78;
      sVar10 = AstExpr::as<nigel::AstReturning>((AstExpr *)local_78);
      _Var6 = sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (this_02 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        _Var6._M_pi = extraout_RDX;
      }
      sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var6._M_pi;
      sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pAVar4;
      return (shared_ptr<nigel::AstReturning>)
             sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
    }
    AstExpr::as<nigel::AstArithmeticCondition>((AstExpr *)local_b8);
    (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_b8._0_8_ + 0x30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8._0_8_ + 0x38));
    pp_Var1 = local_a0;
    if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      pp_Var1 = local_a0;
    }
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstComparisonCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;
		while( true )
		{//Split all possible (unatomic) expressions
			if( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstCombinationCondition>();
				currLVal = currLVal->as<AstCombinationCondition>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::comparisonCondition && opPriority[currLVal->as<AstComparisonCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstComparisonCondition>();
				currLVal = currLVal->as<AstComparisonCondition>()->rVal;
			}
			else if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal->as<AstTerm>();
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::arithmenticCondition )
			{
				currLVal = currLVal->as<AstArithmeticCondition>()->ret;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::combinationCondition ) clTerm->as<AstCombinationCondition>()->rVal = cExpr;
			else generateNotification( NT::err_comparisonConditionCannotBeThisRValue, clTerm->token );
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}